

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.h
# Opt level: O0

O3DGCErrorCode __thiscall o3dgc::TriangleFans::AddVertex(TriangleFans *this,long vertex)

{
  long *__src;
  undefined1 auVar1 [16];
  ulong uVar2;
  long *plVar3;
  long lVar4;
  long *tmp;
  long vertex_local;
  TriangleFans *this_local;
  
  if (this->m_numTFANs < 0) {
    __assert_fail("m_numTFANs >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcTriangleFans.h"
                  ,0xda,"O3DGCErrorCode o3dgc::TriangleFans::AddVertex(long)");
  }
  if (this->m_sizeTFANAllocatedSize <= this->m_numTFANs) {
    __assert_fail("m_numTFANs < m_sizeTFANAllocatedSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcTriangleFans.h"
                  ,0xdb,"O3DGCErrorCode o3dgc::TriangleFans::AddVertex(long)");
  }
  if (this->m_numVertices < 0) {
    __assert_fail("m_numVertices >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcTriangleFans.h"
                  ,0xdc,"O3DGCErrorCode o3dgc::TriangleFans::AddVertex(long)");
  }
  this->m_numVertices = this->m_numVertices + 1;
  if (this->m_numVertices == this->m_verticesAllocatedSize) {
    this->m_verticesAllocatedSize = this->m_verticesAllocatedSize << 1;
    __src = this->m_vertices;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->m_verticesAllocatedSize;
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    plVar3 = (long *)operator_new__(uVar2);
    this->m_vertices = plVar3;
    memcpy(this->m_vertices,__src,this->m_numVertices << 3);
    if (__src != (long *)0x0) {
      operator_delete__(__src);
    }
  }
  this->m_vertices[this->m_numVertices + -1] = vertex;
  lVar4 = this->m_numTFANs + -1;
  this->m_sizeTFAN[lVar4] = this->m_sizeTFAN[lVar4] + 1;
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode                AddVertex(long vertex) 
                                    {
                                        assert(m_numTFANs    >= 0);
                                        assert(m_numTFANs    <  m_sizeTFANAllocatedSize);
                                        assert(m_numVertices >= 0);
                                        ++m_numVertices;
                                        if (m_numVertices == m_verticesAllocatedSize)
                                        {
                                            m_verticesAllocatedSize *= 2;
                                            long * tmp = m_vertices;
                                            m_vertices = new long [m_verticesAllocatedSize];
                                            memcpy(m_vertices, tmp, sizeof(long) * m_numVertices);
                                            delete [] tmp;
                                        }
                                        m_vertices[m_numVertices-1] = vertex;
                                        ++m_sizeTFAN[m_numTFANs-1];
                                        return O3DGC_OK;
                                    }